

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

FixedTypedVector * __thiscall
flexbuffers::Reference::AsFixedTypedVector(FixedTypedVector *__return_storage_ptr__,Reference *this)

{
  byte bVar1;
  ulong *puVar2;
  int fixed_type;
  uint uVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  ulong uVar8;
  
  uVar3 = this->type_ - FBT_VECTOR_INT2;
  if (uVar3 < 9) {
    puVar2 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar8 = (ulong)(byte)*puVar2;
      }
      else {
        uVar8 = (ulong)(ushort)*puVar2;
      }
    }
    else if (bVar1 < 8) {
      uVar8 = (ulong)(uint)*puVar2;
    }
    else {
      uVar8 = *puVar2;
    }
    uVar7 = (char)(uVar3 / 3) + '\x02';
    iVar4 = uVar3 % 3 + 1;
    puVar5 = (uint8_t *)((long)puVar2 - uVar8);
    uVar6 = this->byte_width_;
  }
  else {
    iVar4 = 1;
    uVar6 = '\x01';
    puVar5 = "";
    uVar7 = '\0';
  }
  (__return_storage_ptr__->super_Object).data_ = puVar5;
  (__return_storage_ptr__->super_Object).byte_width_ = uVar6;
  *(int *)&(__return_storage_ptr__->super_Object).field_0xc = iVar4;
  __return_storage_ptr__->len_ = uVar7;
  return __return_storage_ptr__;
}

Assistant:

FixedTypedVector AsFixedTypedVector() const {
    if (IsFixedTypedVector()) {
      uint8_t len = 0;
      auto vtype = ToFixedTypedVectorElementType(type_, &len);
      return FixedTypedVector(Indirect(), byte_width_, vtype, len);
    } else {
      return FixedTypedVector::EmptyFixedTypedVector();
    }
  }